

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O1

double __thiscall tcu::FloatFormat::round(FloatFormat *this,double __x)

{
  uint in_EAX;
  int iVar1;
  int in_ESI;
  double dVar2;
  int exp;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  dVar2 = deFractExp(__x,(int *)((long)&uStack_28 + 4));
  iVar1 = this->m_minExp - uStack_28._4_4_;
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  iVar1 = this->m_fractionBits - iVar1;
  dVar2 = ldexp(dVar2,iVar1);
  if (in_ESI == 0) {
    dVar2 = floor(dVar2);
  }
  else {
    dVar2 = ceil(dVar2);
  }
  dVar2 = ldexp(dVar2,uStack_28._4_4_ - iVar1);
  return dVar2;
}

Assistant:

double FloatFormat::round (double d, bool upward) const
{
	int				exp			= 0;
	const double	frac		= deFractExp(d, &exp);
	const int		shift		= exponentShift(exp);
	const double	shiftFrac	= deLdExp(frac, shift);
	const double	roundFrac	= upward ? deCeil(shiftFrac) : deFloor(shiftFrac);

	return deLdExp(roundFrac, exp - shift);
}